

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiak.c
# Opt level: O0

adiak_datatype_t * adiak_get_basetype(adiak_type_t t)

{
  adiak_datatype_t *paStack_10;
  adiak_type_t t_local;
  
  switch(t) {
  case adiak_type_unset:
    paStack_10 = (adiak_datatype_t *)0x0;
    break;
  case adiak_long:
    paStack_10 = &base_long;
    break;
  case adiak_ulong:
    paStack_10 = &base_ulong;
    break;
  case adiak_int:
    paStack_10 = &base_int;
    break;
  case adiak_uint:
    paStack_10 = &base_uint;
    break;
  case adiak_double:
    paStack_10 = &base_double;
    break;
  case adiak_date:
    paStack_10 = &base_date;
    break;
  case adiak_timeval:
    paStack_10 = &base_timeval;
    break;
  case adiak_version:
    paStack_10 = &base_version;
    break;
  case adiak_string:
    paStack_10 = &base_string;
    break;
  case adiak_catstring:
    paStack_10 = &base_catstring;
    break;
  case adiak_path:
    paStack_10 = &base_path;
    break;
  case adiak_range:
  case adiak_set:
  case adiak_list:
  case adiak_tuple:
  default:
    paStack_10 = (adiak_datatype_t *)0x0;
    break;
  case adiak_longlong:
    paStack_10 = &base_longlong;
    break;
  case adiak_ulonglong:
    paStack_10 = &base_ulonglong;
  }
  return paStack_10;
}

Assistant:

adiak_datatype_t *adiak_get_basetype(adiak_type_t t)
{
   switch (t) {
      case adiak_type_unset:
         return NULL;
      case adiak_long:
         return &base_long;
      case adiak_ulong:
         return &base_ulong;
      case adiak_longlong:
         return &base_longlong;
      case adiak_ulonglong:
         return &base_ulonglong;
      case adiak_int:
         return &base_int;
      case adiak_uint:
         return &base_uint;
      case adiak_double:
         return &base_double;
      case adiak_date:
         return &base_date;
      case adiak_timeval:
         return &base_timeval;
      case adiak_version:
         return &base_version;
      case adiak_string:
         return &base_string;
      case adiak_catstring:
         return &base_catstring;
      case adiak_path:
         return &base_path;
      case adiak_range:
      case adiak_set:
      case adiak_list:
      case adiak_tuple:
      default:
         return NULL;
   }
}